

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

Vec_Wec_t * Gia_ManLevelizeR(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Wec_t *pVVar5;
  Gia_Obj_t *pObj;
  int v;
  int iVar6;
  int local_54;
  Vec_Int_t *local_48;
  
  uVar2 = Gia_ManLevelRNum(p);
  iVar6 = uVar2 + 1;
  pVVar5 = (Vec_Wec_t *)malloc(0x10);
  local_54 = 8;
  if (6 < uVar2) {
    local_54 = iVar6;
  }
  pVVar5->nCap = local_54;
  v = 0;
  if (local_54 == 0) {
    local_48 = (Vec_Int_t *)0x0;
  }
  else {
    local_48 = (Vec_Int_t *)calloc((long)local_54,0x10);
  }
  pVVar5->pArray = local_48;
  pVVar5->nSize = iVar6;
  do {
    if ((p->nObjs <= v) || (pObj = Gia_ManObj(p,v), pObj == (Gia_Obj_t *)0x0)) {
      return pVVar5;
    }
    if ((v != 0) &&
       (((int)*(uint *)pObj < 0 && (~*(uint *)pObj & 0x1fffffff) != 0 ||
        (iVar3 = Gia_ObjLevel(p,pObj), iVar3 != 0)))) {
      uVar4 = Gia_ObjLevel(p,pObj);
      if ((int)uVar2 < (int)uVar4) {
        __assert_fail("Level <= nLevels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDfs.c"
                      ,0x1ba,"Vec_Wec_t *Gia_ManLevelizeR(Gia_Man_t *)");
      }
      if (iVar6 <= (int)uVar4) {
        iVar3 = uVar4 + 1;
        iVar1 = iVar6 * 2;
        if (iVar6 * 2 <= iVar3) {
          iVar1 = iVar3;
        }
        if (iVar1 - local_54 != 0 && local_54 <= iVar1) {
          if (local_48 == (Vec_Int_t *)0x0) {
            local_48 = (Vec_Int_t *)malloc((long)iVar1 << 4);
          }
          else {
            local_48 = (Vec_Int_t *)realloc(local_48,(long)iVar1 << 4);
          }
          pVVar5->pArray = local_48;
          memset(local_48 + local_54,0,(long)(iVar1 - local_54) << 4);
          pVVar5->nCap = iVar1;
          local_54 = iVar1;
        }
        pVVar5->nSize = iVar3;
        iVar6 = iVar3;
      }
      if (((int)uVar4 < 0) || (iVar6 <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(local_48 + uVar4,v);
    }
    v = v + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_ManLevelizeR( Gia_Man_t * p )
{ 
    Gia_Obj_t * pObj;
    Vec_Wec_t * vLevels;
    int nLevels, Level, i;
    nLevels = Gia_ManLevelRNum( p );
    vLevels = Vec_WecStart( nLevels + 1 );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( i == 0 || (!Gia_ObjIsCo(pObj) && !Gia_ObjLevel(p, pObj)) )
            continue;
        Level = Gia_ObjLevel( p, pObj );
        assert( Level <= nLevels );
        Vec_WecPush( vLevels, Level, i );
    }
    return vLevels;
}